

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  resizeLike<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            (this,(EigenBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)other);
  _set_noalias<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            (this,other);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }